

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_sdiv(BtorSimBitVector *a,BtorSimBitVector *b)

{
  _Bool _Var1;
  BtorSimBitVector *bv;
  BtorSimBitVector *bv_00;
  BtorSimBitVector *pBVar2;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_00;
  BtorSimBitVector *bv_01;
  BtorSimBitVector *__ptr;
  BtorSimBitVector *__ptr_00;
  BtorSimBitVector *a_01;
  BtorSimBitVector *b_01;
  uint32_t uVar3;
  
  if (a->width == 1) {
    bv = btorsim_bv_not(a);
    bv_00 = btorsim_bv_and(bv,b);
    pBVar2 = btorsim_bv_not(bv_00);
  }
  else {
    uVar3 = a->width - 1;
    a_00 = btorsim_bv_slice(a,uVar3,uVar3);
    uVar3 = b->width - 1;
    b_00 = btorsim_bv_slice(b,uVar3,uVar3);
    bv_01 = btorsim_bv_xor(a_00,b_00);
    __ptr = btorsim_bv_neg(a);
    __ptr_00 = btorsim_bv_neg(b);
    _Var1 = btorsim_bv_is_true(a_00);
    if (_Var1) {
      a = __ptr;
    }
    a_01 = btorsim_bv_copy(a);
    _Var1 = btorsim_bv_is_true(b_00);
    if (_Var1) {
      b = __ptr_00;
    }
    b_01 = btorsim_bv_copy(b);
    bv = btorsim_bv_udiv(a_01,b_01);
    bv_00 = btorsim_bv_neg(bv);
    _Var1 = btorsim_bv_is_true(bv_01);
    pBVar2 = bv;
    if (_Var1) {
      pBVar2 = bv_00;
    }
    pBVar2 = btorsim_bv_copy(pBVar2);
    free(a_00);
    free(b_00);
    free(bv_01);
    free(__ptr);
    free(__ptr_00);
    free(a_01);
    free(b_01);
  }
  free(bv);
  free(bv_00);
  return pBVar2;
}

Assistant:

BtorSimBitVector *
btorsim_bv_sdiv (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  BtorSimBitVector *res = 0, *not_a, *not_a_and_b, *sign_a, *sign_b, *xor;
  BtorSimBitVector *neg_a, *neg_b, *cond_a, *cond_b, *udiv, *neg_udiv;

  if (a->width == 1)
  {
    not_a       = btorsim_bv_not (a);
    not_a_and_b = btorsim_bv_and (not_a, b);
    res         = btorsim_bv_not (not_a_and_b);
    btorsim_bv_free (not_a);
    btorsim_bv_free (not_a_and_b);
  }
  else
  {
    sign_a   = btorsim_bv_slice (a, a->width - 1, a->width - 1);
    sign_b   = btorsim_bv_slice (b, b->width - 1, b->width - 1);
    xor      = btorsim_bv_xor (sign_a, sign_b);
    neg_a    = btorsim_bv_neg (a);
    neg_b    = btorsim_bv_neg (b);
    cond_a   = btorsim_bv_is_true (sign_a) ? btorsim_bv_copy (neg_a)
                                           : btorsim_bv_copy (a);
    cond_b   = btorsim_bv_is_true (sign_b) ? btorsim_bv_copy (neg_b)
                                           : btorsim_bv_copy (b);
    udiv     = btorsim_bv_udiv (cond_a, cond_b);
    neg_udiv = btorsim_bv_neg (udiv);
    res      = btorsim_bv_is_true (xor) ? btorsim_bv_copy (neg_udiv)
                                        : btorsim_bv_copy (udiv);
    btorsim_bv_free (sign_a);
    btorsim_bv_free (sign_b);
    btorsim_bv_free (xor);
    btorsim_bv_free (neg_a);
    btorsim_bv_free (neg_b);
    btorsim_bv_free (cond_a);
    btorsim_bv_free (cond_b);
    btorsim_bv_free (udiv);
    btorsim_bv_free (neg_udiv);
  }

  assert (res);
  assert (rem_bits_zero_dbg (res));

  return res;
}